

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlfield.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QSqlField *f)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  RequiredStatus RVar4;
  QDebug *pQVar5;
  QVariant *variant;
  QSqlField *this;
  QDebug *other;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  QDebugStateSaver saver;
  DataPointer *in_stack_fffffffffffffe98;
  char t;
  QSqlField *in_stack_fffffffffffffea0;
  QSqlField *in_stack_fffffffffffffea8;
  QDebug *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  char *in_stack_fffffffffffffee8;
  QDebug local_c0;
  QArrayDataPointer<char16_t> local_b8 [3];
  QMetaType local_70 [4];
  undefined8 local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 0xaaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)in_RSI);
  QDebug::nospace(in_RSI);
  pQVar5 = QDebug::operator<<((QDebug *)
                              CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                              in_stack_fffffffffffffee8);
  QSqlField::name(in_stack_fffffffffffffea8);
  QDebug::operator<<(in_stack_fffffffffffffeb0,(QString *)in_stack_fffffffffffffea8);
  QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                     (char *)pQVar5);
  local_70[0] = QSqlField::metaType(in_stack_fffffffffffffea0);
  QMetaType::name(local_70);
  QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                     (char *)pQVar5);
  QString::~QString((QString *)0x133720);
  QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                     (char *)pQVar5);
  QSqlField::tableName(in_stack_fffffffffffffea8);
  bVar1 = QString::isEmpty((QString *)0x133755);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_b8,(Data *)0x0,L"(not specified)",0xf);
    QString::QString((QString *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  else {
    QSqlField::tableName(in_stack_fffffffffffffea8);
  }
  QDebug::operator<<(in_stack_fffffffffffffeb0,(QString *)in_stack_fffffffffffffea8);
  QString::~QString((QString *)0x1337fa);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffea0);
  }
  QString::~QString((QString *)0x13381d);
  iVar3 = QSqlField::length((QSqlField *)0x133827);
  if (-1 < iVar3) {
    QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                       (char *)pQVar5);
    QSqlField::length((QSqlField *)0x13384c);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffea0,
                       (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  }
  iVar3 = QSqlField::precision((QSqlField *)0x133862);
  if (-1 < iVar3) {
    QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                       (char *)pQVar5);
    QSqlField::precision((QSqlField *)0x133887);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffea0,
                       (int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  }
  t = (char)((ulong)in_stack_fffffffffffffe98 >> 0x38);
  RVar4 = QSqlField::requiredStatus((QSqlField *)0x13389d);
  if (RVar4 != Unknown) {
    QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                       (char *)pQVar5);
    QSqlField::requiredStatus((QSqlField *)0x1338c2);
    QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                       (char *)pQVar5);
  }
  variant = (QVariant *)
            QDebug::operator<<((QDebug *)
                               CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                               (char *)pQVar5);
  QSqlField::isGenerated((QSqlField *)0x133903);
  QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                     (char *)pQVar5);
  QSqlField::defaultValue(in_stack_fffffffffffffea8);
  bVar2 = QVariant::isNull();
  bVar2 = bVar2 ^ 0xff;
  QVariant::~QVariant(&local_28);
  if ((bVar2 & 1) != 0) {
    this = (QSqlField *)
           QDebug::operator<<((QDebug *)CONCAT17(bVar2,in_stack_fffffffffffffeb8),(char *)pQVar5);
    QSqlField::defaultValue(this);
    operator<<((QDebug *)CONCAT17(bVar2,in_stack_fffffffffffffeb8),variant);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffea0,t);
    QDebug::~QDebug(&local_c0);
    QVariant::~QVariant(&local_48);
  }
  other = QDebug::operator<<((QDebug *)CONCAT17(bVar2,in_stack_fffffffffffffeb8),(char *)pQVar5);
  QSqlField::isAutoValue((QSqlField *)0x1339ed);
  QDebug::operator<<((QDebug *)in_stack_fffffffffffffea0,SUB81((ulong)other >> 0x38,0));
  pQVar5 = QDebug::operator<<((QDebug *)CONCAT17(bVar2,in_stack_fffffffffffffeb8),(char *)pQVar5);
  QSqlField::isReadOnly((QSqlField *)0x133a17);
  QDebug::operator<<(pQVar5,SUB81((ulong)other >> 0x38,0));
  QDebug::operator<<(pQVar5,(char)((ulong)other >> 0x38));
  QDebug::QDebug(pQVar5,other);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QSqlField &f)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QSqlField(" << f.name() << ", " << f.metaType().name();
    dbg << ", tableName: " << (f.tableName().isEmpty() ? QStringLiteral("(not specified)") : f.tableName());
    if (f.length() >= 0)
        dbg << ", length: " << f.length();
    if (f.precision() >= 0)
        dbg << ", precision: " << f.precision();
    if (f.requiredStatus() != QSqlField::Unknown)
        dbg << ", required: "
            << (f.requiredStatus() == QSqlField::Required ? "yes" : "no");
    dbg  << ", generated: " << (f.isGenerated() ? "yes" : "no");
    if (!f.defaultValue().isNull())
        dbg << ", defaultValue: \"" << f.defaultValue() << '\"';
    dbg << ", autoValue: " << f.isAutoValue()
        << ", readOnly: " << f.isReadOnly() << ')';
    return dbg;
}